

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcSymObj * __thiscall CTcParser::add_gen_obj(CTcParser *this,char *clsname)

{
  tc_symtype_t tVar1;
  CTcSymbol *this_00;
  CTcSymObj *pCVar2;
  char *in_RSI;
  textchar_t *in_RDI;
  CTcSymObj *in_stack_00000010;
  CTcSymObj *cls;
  CTcPrsSymtab *this_01;
  
  this_01 = *(CTcPrsSymtab **)(in_RDI + 0x80);
  strlen(in_RSI);
  this_00 = CTcPrsSymtab::find(this_01,in_RDI,0x2a3449);
  if ((this_00 != (CTcSymbol *)0x0) &&
     (tVar1 = CTcSymbolBase::get_type(&this_00->super_CTcSymbolBase), tVar1 == TC_SYM_OBJ)) {
    pCVar2 = add_gen_obj((CTcParser *)cls,in_stack_00000010);
    return pCVar2;
  }
  return (CTcSymObj *)0x0;
}

Assistant:

CTcSymObj *CTcParser::add_gen_obj(const char *clsname)
{
    /* look up the class symbol */
    CTcSymObj *cls = (CTcSymObj *)global_symtab_->find(
        clsname, strlen(clsname));

    /* make sure we found an object symbol */
    if (cls != 0 && cls->get_type() == TC_SYM_OBJ)
    {
        /* got it - go create the object */
        return add_gen_obj(cls);
    }
    else
    {
        /* not an object - return failure */
        return 0;
    }
}